

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

unique_ptr<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>_> __thiscall
flow::lang::Parser::resolve
          (Parser *this,
          list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *callables,
          ParamList *params)

{
  CallableSym *pCVar1;
  _List_node_base *p_Var2;
  undefined8 *******pppppppuVar3;
  undefined8 *******pppppppuVar4;
  bool bVar5;
  CallExpr *pCVar6;
  _List_node_base *p_Var7;
  _Node *p_Var8;
  size_t *psVar9;
  Signature *pSVar10;
  ParamList *in_RCX;
  const_iterator __end2;
  ParamList *pPVar11;
  _Head_base<0UL,_flow::lang::CallExpr_*,_false> _Var12;
  string msg;
  CallableSym *callee;
  Signature inputSignature;
  string local_150;
  _Head_base<0UL,_flow::lang::CallExpr_*,_false> local_130;
  undefined8 *******local_128;
  undefined8 *******local_120;
  size_t local_118;
  CallableSym *local_110;
  _List_base<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  Signature local_f0;
  Signature local_b0;
  Signature local_70;
  
  local_130._M_head_impl = (CallExpr *)this;
  makeSignature(&local_70,*(CallableSym **)(*(long *)params + 0x10),in_RCX);
  pPVar11 = params;
  while (pPVar11 = *(ParamList **)pPVar11, pPVar11 != params) {
    pCVar1 = (CallableSym *)
             (pPVar11->names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = CallableSym::isDirectMatch(pCVar1,in_RCX);
    if (bVar5) {
      pCVar6 = (CallExpr *)operator_new(0x80);
      CallExpr::CallExpr(pCVar6,&(pCVar1->super_Symbol).super_ASTNode.location_,pCVar1,in_RCX);
      *(CallExpr **)local_130._M_head_impl = pCVar6;
      _Var12._M_head_impl = local_130._M_head_impl;
LAB_001295cc:
      if (local_70.args_.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.args_.
                        super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.args_.
                              super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.args_.
                              super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.name_._M_dataplus._M_p != &local_70.name_.field_2) {
        operator_delete(local_70.name_._M_dataplus._M_p,
                        local_70.name_.field_2._M_allocated_capacity + 1);
      }
      return (__uniq_ptr_data<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>,_true,_true>
              )(tuple<flow::lang::CallExpr_*,_std::default_delete<flow::lang::CallExpr>_>)
               _Var12._M_head_impl;
    }
  }
  local_128 = &local_128;
  local_118 = 0;
  local_108._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_108;
  local_108._M_impl._M_node._M_size = 0;
  pPVar11 = *(ParamList **)params;
  local_120 = local_128;
  local_108._M_impl._M_node.super__List_node_base._M_prev =
       local_108._M_impl._M_node.super__List_node_base._M_next;
  if (pPVar11 != params) {
    do {
      local_110 = (CallableSym *)
                  (pPVar11->names_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      local_150._M_string_length = 0;
      local_150.field_2._M_local_buf[0] = '\0';
      bVar5 = CallableSym::tryMatch(local_110,in_RCX,&local_150);
      if (bVar5) {
        p_Var7 = (_List_node_base *)operator_new(0x18);
        p_Var7[1]._M_next = (_List_node_base *)local_110;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        psVar9 = &local_118;
      }
      else {
        p_Var8 = std::__cxx11::
                 list<std::pair<flow::lang::CallableSym*,std::__cxx11::string>,std::allocator<std::pair<flow::lang::CallableSym*,std::__cxx11::string>>>
                 ::_M_create_node<flow::lang::CallableSym*&,std::__cxx11::string&>
                           ((list<std::pair<flow::lang::CallableSym*,std::__cxx11::string>,std::allocator<std::pair<flow::lang::CallableSym*,std::__cxx11::string>>>
                             *)&local_108,&local_110,&local_150);
        std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
        psVar9 = &local_108._M_impl._M_node._M_size;
      }
      *psVar9 = *psVar9 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,
                        CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                 local_150.field_2._M_local_buf[0]) + 1);
      }
      pPVar11 = *(ParamList **)pPVar11;
    } while (pPVar11 != params);
    if ((undefined8 ********)local_128 != &local_128) {
      if (local_118 < 2) {
        pCVar1 = (CallableSym *)local_128[2];
        if ((pCVar1->nativeCallback_->attributes_ & 1) != 0) {
          p_Var7 = callables[2].
                   super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
          p_Var2 = callables[4].
                   super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                   ._M_impl._M_node.super__List_node_base._M_prev;
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_150,"Using experimental builtin API {}.","");
          pSVar10 = NativeCallback::signature(pCVar1->nativeCallback_);
          Signature::Signature(&local_f0,pSVar10);
          diagnostics::Report::warning<flow::Signature>
                    ((Report *)p_Var2,(SourceLocation *)(p_Var7 + 3),&local_150,&local_f0);
          if (local_f0.args_.
              super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f0.args_.
                            super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_f0.args_.
                                  super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f0.args_.
                                  super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0.name_._M_dataplus._M_p != &local_f0.name_.field_2) {
            operator_delete(local_f0.name_._M_dataplus._M_p,
                            local_f0.name_.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,
                            CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                     local_150.field_2._M_local_buf[0]) + 1);
          }
        }
        pCVar6 = (CallExpr *)operator_new(0x80);
        CallExpr::CallExpr(pCVar6,&(pCVar1->super_Symbol).super_ASTNode.location_,pCVar1,in_RCX);
        _Var12._M_head_impl = local_130._M_head_impl;
      }
      else {
        p_Var7 = callables[2].
                 super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
        p_Var2 = callables[4].
                 super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                 ._M_impl._M_node.super__List_node_base._M_prev;
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,"Call to builtin is ambiguous.","");
        diagnostics::Report::typeError<>((Report *)p_Var2,(SourceLocation *)(p_Var7 + 3),&local_150)
        ;
        _Var12._M_head_impl = local_130._M_head_impl;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,
                          CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                   local_150.field_2._M_local_buf[0]) + 1);
        }
        pCVar6 = (CallExpr *)0x0;
      }
      goto LAB_001295a0;
    }
  }
  p_Var7 = callables[2].
           super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  p_Var2 = callables[4].
           super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>.
           _M_impl._M_node.super__List_node_base._M_prev;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"No matching signature for {}.","");
  Signature::Signature(&local_b0,&local_70);
  diagnostics::Report::typeError<flow::Signature>
            ((Report *)p_Var2,(SourceLocation *)(p_Var7 + 3),&local_150,&local_b0);
  if (local_b0.args_.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.args_.
                    super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.args_.
                          super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.args_.
                          super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.name_._M_dataplus._M_p != &local_b0.name_.field_2) {
    operator_delete(local_b0.name_._M_dataplus._M_p,local_b0.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]) + 1);
  }
  pCVar6 = (CallExpr *)0x0;
  p_Var7 = (_List_node_base *)&local_108;
  while (p_Var7 = (((_List_impl *)&p_Var7->_M_next)->_M_node).super__List_node_base._M_next,
        _Var12._M_head_impl = local_130._M_head_impl, p_Var7 != (_List_node_base *)&local_108) {
    diagnostics::Report::typeError<>
              ((Report *)
               callables[4].
               super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
               ._M_impl._M_node.super__List_node_base._M_prev,
               (SourceLocation *)
               (callables[2].
                super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                ._M_impl._M_node.super__List_node_base._M_next + 3),(string *)&p_Var7[1]._M_prev);
  }
LAB_001295a0:
  *(CallExpr **)_Var12._M_head_impl = pCVar6;
  std::__cxx11::
  _List_base<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_clear(&local_108);
  pppppppuVar4 = local_128;
  while ((undefined8 ********)pppppppuVar4 != &local_128) {
    pppppppuVar3 = (undefined8 *******)*pppppppuVar4;
    operator_delete(pppppppuVar4,0x18);
    pppppppuVar4 = pppppppuVar3;
  }
  goto LAB_001295cc;
}

Assistant:

std::unique_ptr<CallExpr> Parser::resolve(
    const std::list<CallableSym*>& callables, ParamList&& params) {
  Signature inputSignature = makeSignature(callables.front(), params);

  // attempt to find a full match first
  for (CallableSym* callee : callables) {
    if (callee->isDirectMatch(params)) {
      return std::make_unique<CallExpr>(callee->location(), callee,
                                        std::move(params));
    }
  }

  // attempt to find something with default values or parameter-reordering (if
  // named args)
  std::list<CallableSym*> result;
  std::list<std::pair<CallableSym*, std::string>> matchErrors;

  for (CallableSym* callee : callables) {
    std::string msg;
    if (callee->tryMatch(params, &msg)) {
      result.push_back(callee);
    } else {
      matchErrors.emplace_back(callee, msg);
    }
  }

  if (result.empty()) {
    report_.typeError(lastLocation(), "No matching signature for {}.", inputSignature);
    for (const auto& me : matchErrors) {
      report_.typeError(lastLocation(), me.second);
    }
    return nullptr;
  }

  if (result.size() > 1) {
    report_.typeError(lastLocation(), "Call to builtin is ambiguous.");
    return nullptr;
  }

  CallableSym* callableSym = result.front();

  if (callableSym->nativeCallback()->isExperimental()) {
    report_.warning(lastLocation(),
                    "Using experimental builtin API {}.",
                    callableSym->nativeCallback()->signature());
  }

  return std::make_unique<CallExpr>(callableSym->location(), callableSym,
                                    std::move(params));
}